

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O2

void llama_batch_free(llama_batch batch)

{
  float *pfVar1;
  void *in_stack_00000010;
  void *in_stack_00000018;
  
  free(in_stack_00000010);
  free(in_stack_00000018);
  free((void *)batch._0_8_);
  free(batch.token);
  pfVar1 = batch.embd;
  if (batch.embd != (float *)0x0) {
    for (; *(void **)pfVar1 != (void *)0x0; pfVar1 = pfVar1 + 2) {
      free(*(void **)pfVar1);
    }
    free(batch.embd);
  }
  free(batch.pos);
  return;
}

Assistant:

void llama_batch_free(struct llama_batch batch) {
    if (batch.token)    free(batch.token);
    if (batch.embd)     free(batch.embd);
    if (batch.pos)      free(batch.pos);
    if (batch.n_seq_id) free(batch.n_seq_id);
    if (batch.seq_id) {
        for (int i = 0; batch.seq_id[i] != nullptr; ++i) {
            free(batch.seq_id[i]);
        }
        free(batch.seq_id);
    }
    if (batch.logits)   free(batch.logits);
}